

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O0

void AddFontSize(TidyDocImpl *doc,Node *node,ctmbstr size)

{
  int iVar1;
  tmbstr ptVar2;
  tmbchar local_68 [8];
  tmbchar buf [64];
  ctmbstr value;
  ctmbstr size_local;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  buf[0x38] = '\0';
  buf[0x39] = '\0';
  buf[0x3a] = '\0';
  buf[0x3b] = '\0';
  buf[0x3c] = '\0';
  buf[0x3d] = '\0';
  buf[0x3e] = '\0';
  buf[0x3f] = '\0';
  if (((node != (Node *)0x0) && (node->tag != (Dict *)0x0)) && (node->tag->id == TidyTag_P)) {
    iVar1 = prvTidytmbstrcmp(size,"6");
    if (iVar1 == 0) {
      buf._56_8_ = anon_var_dwarf_1037b;
    }
    else {
      iVar1 = prvTidytmbstrcmp(size,"5");
      if (iVar1 == 0) {
        buf._56_8_ = (long)"csiso85spanish2" + 0xd;
      }
      else {
        iVar1 = prvTidytmbstrcmp(size,"4");
        if (iVar1 == 0) {
          buf._56_8_ = anon_var_dwarf_1038f;
        }
      }
    }
    if (buf._56_8_ != 0) {
      (*doc->allocator->vtbl->free)(doc->allocator,node->element);
      ptVar2 = prvTidytmbstrdup(doc->allocator,(ctmbstr)buf._56_8_);
      node->element = ptVar2;
      prvTidyFindTag(doc,node);
      return;
    }
  }
  buf._56_8_ = FontSize2Name(size);
  if ((ctmbstr)buf._56_8_ != (ctmbstr)0x0) {
    prvTidytmbsnprintf(local_68,0x40,"font-size: %s",buf._56_8_);
    prvTidyAddStyleProperty(doc,node,local_68);
  }
  return;
}

Assistant:

static void AddFontSize( TidyDocImpl* doc, Node* node, ctmbstr size )
{
    ctmbstr value = NULL;

    if (nodeIsP(node))
    {
        if (TY_(tmbstrcmp)(size, "6") == 0)
            value = "h1";
        else if (TY_(tmbstrcmp)(size, "5") == 0)
            value = "h2";
        else if (TY_(tmbstrcmp)(size, "4") == 0)
            value = "h3";

        if (value)
        {
            TidyDocFree(doc, node->element);
            node->element = TY_(tmbstrdup)(doc->allocator, value);
            TY_(FindTag)(doc, node);
            return;
        }
    }

    value = FontSize2Name(size);

    if (value)
    {
        tmbchar buf[64];
        TY_(tmbsnprintf)(buf, sizeof(buf), "font-size: %s", value);
        TY_(AddStyleProperty)( doc, node, buf );
    }
}